

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenerate.cpp
# Opt level: O0

void __thiscall
luna::CodeGenerateVisitor::Visit(CodeGenerateVisitor *this,VarList *var_list,void *data)

{
  size_type sVar1;
  pointer pSVar2;
  int *in_RDX;
  long in_RSI;
  undefined8 in_RDI;
  ExpVarData_conflict exp_var_data;
  int i;
  int var_count;
  int end_register;
  int register_id;
  VarListData_conflict *var_list_data;
  ExpVarData local_38;
  int local_2c;
  int local_28;
  int local_24;
  long local_10;
  
  local_24 = *in_RDX;
  local_28 = in_RDX[1];
  local_10 = in_RSI;
  sVar1 = std::
          vector<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>,_std::allocator<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>_>_>
          ::size((vector<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>,_std::allocator<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>_>_>
                  *)(in_RSI + 8));
  local_2c = (int)sVar1;
  if (local_28 - local_24 == local_2c) {
    for (local_38._8_4_ = 0; (int)local_38._8_4_ < local_2c; local_38._8_4_ = local_38._8_4_ + 1) {
      ExpVarData::ExpVarData(&local_38,local_24,local_24 + 1);
      std::
      vector<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>,_std::allocator<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>_>_>
      ::operator[]((vector<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>,_std::allocator<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>_>_>
                    *)(local_10 + 8),(long)(int)local_38._8_4_);
      pSVar2 = std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::operator->
                         ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                          0x1a22c1);
      (*pSVar2->_vptr_SyntaxTree[2])(pSVar2,in_RDI,&local_38);
      local_24 = local_24 + 1;
    }
    return;
  }
  __assert_fail("end_register - register_id == var_count",
                "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp"
                ,0x4b1,"virtual void luna::CodeGenerateVisitor::Visit(VarList *, void *)");
}

Assistant:

void CodeGenerateVisitor::Visit(VarList *var_list, void *data)
    {
        auto var_list_data = static_cast<VarListData *>(data);
        int register_id = var_list_data->start_register_;
        int end_register = var_list_data->end_register_;
        int var_count = var_list->var_list_.size();
        assert(end_register - register_id == var_count);

        // Assign results to each variable
        for (int i = 0; i < var_count; ++i, ++register_id)
        {
            ExpVarData exp_var_data{ register_id, register_id + 1 };
            var_list->var_list_[i]->Accept(this, &exp_var_data);
        }
    }